

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O2

Status * google::protobuf::util::converter::ProtoStreamObjectWriter::RenderDuration
                   (Status *__return_storage_ptr__,ProtoStreamObjectWriter *ow,DataPiece *data)

{
  StringPiece default_string;
  StringPiece s;
  bool bVar1;
  stringpiece_ssize_type sVar2;
  size_type n;
  uint64 uVar3;
  int iVar4;
  char *pcVar5;
  Status *this;
  int iVar6;
  StringPiece *pSVar7;
  size_type sVar8;
  int iVar9;
  StringPiece SVar10;
  StringPiece str;
  StringPiece str_00;
  StringPiece error_message;
  uint64 *puStack_190;
  StringPiece local_180;
  StringPiece local_170;
  StringPiece local_160;
  StringPiece local_150;
  StringPiece local_140;
  undefined1 local_130 [32];
  StringPiece local_110;
  StringPiece local_100;
  StringPiece local_f0;
  undefined1 local_e0 [32];
  bool local_c0;
  long local_b0;
  uint64 unsigned_seconds;
  string local_a0;
  StringPiece local_80;
  ProtoStreamObjectWriter *local_70;
  undefined1 local_68 [8];
  Status nanos_status;
  uint local_34 [2];
  int32 i_nanos;
  
  if (data->type_ == TYPE_STRING) {
    local_80 = DataPiece::str(data);
    StringPiece::ToString_abi_cxx11_((string *)local_68,&local_80);
    std::__cxx11::string::string((string *)local_e0,"s",(allocator *)&local_a0);
    bVar1 = HasSuffixString((string *)local_68,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)local_68);
    if (bVar1) {
      local_70 = ow;
      SVar10 = StringPiece::substr(&local_80,0,local_80.length_ - 1);
      local_80 = SVar10;
      StringPiece::StringPiece(&local_160,"-");
      bVar1 = HasPrefixString(SVar10,local_160);
      if (bVar1) {
        local_80 = StringPiece::substr(&local_80,1,0xffffffffffffffff);
        puStack_190 = (uint64 *)0xffffffffffffffff;
      }
      else {
        puStack_190 = (uint64 *)0x1;
      }
      iVar4 = (int)puStack_190;
      _local_68 = local_80;
      n = StringPiece::rfind((StringPiece *)local_68,'.',0xffffffffffffffff);
      unsigned_seconds = 0xffffffffffffffff;
      if (n == 0xffffffffffffffff) {
        local_e0._0_16_ = ZEXT816(0);
        SVar10 = _local_68;
      }
      else {
        SVar10 = StringPiece::substr((StringPiece *)local_68,0,n);
        local_e0._0_16_ =
             (undefined1  [16])StringPiece::substr((StringPiece *)local_68,n + 1,0xffffffffffffffff)
        ;
      }
      str.length_ = (stringpiece_ssize_type)&local_b0;
      str.ptr_ = (char *)SVar10.length_;
      bVar1 = safe_strtou64((protobuf *)SVar10.ptr_,str,puStack_190);
      if (bVar1) {
        iVar6 = -2;
        do {
          StringPiece::StringPiece((StringPiece *)&local_a0,"0");
          SVar10.length_ = local_a0._M_string_length;
          SVar10.ptr_ = local_a0._M_dataplus._M_p;
          bVar1 = StringPiece::Consume((StringPiece *)local_e0,SVar10);
          iVar6 = iVar6 + 1;
        } while (bVar1);
        local_34[0] = 0;
        if ((char *)local_e0._8_8_ == (char *)0x0) {
LAB_0033a083:
          StringPiece::StringPiece((StringPiece *)local_130,"0123456789");
          s.length_ = local_130._8_8_;
          s.ptr_ = (char *)local_130._0_8_;
          iVar9 = 0;
          uVar3 = StringPiece::find_first_not_of((StringPiece *)local_e0,s,0);
          if (uVar3 == unsigned_seconds) {
            if ((int)local_34[0] < 1) {
              iVar9 = 0;
            }
            else {
              if (8 < (uint)(iVar6 + local_e0._8_4_)) {
                pcVar5 = "Duration value exceeds limits";
                pSVar7 = &local_140;
                goto LAB_0033a0f3;
              }
              iVar9 = local_34[0] *
                      *(int *)(&DAT_0036e0c8 + (ulong)(uint)(iVar6 + local_e0._8_4_) * 4);
            }
            Status::Status((Status *)local_68);
          }
          else {
            StringPiece::StringPiece
                      (&local_140,"Invalid duration format, failed to parse nano seconds");
            Status::Status((Status *)local_68,INVALID_ARGUMENT,local_140);
          }
        }
        else {
          str_00.length_ = (stringpiece_ssize_type)local_34;
          str_00.ptr_ = (char *)local_e0._8_8_;
          bVar1 = safe_strto32((protobuf *)local_e0._0_8_,str_00,(int32 *)puStack_190);
          if (bVar1) {
            if (local_34[0] < 0x3b9aca01) goto LAB_0033a083;
            pcVar5 = "Duration value exceeds limits";
          }
          else {
            pcVar5 = "Invalid duration format, failed to parse nano seconds";
          }
          pSVar7 = (StringPiece *)local_130;
LAB_0033a0f3:
          StringPiece::StringPiece(pSVar7,pcVar5);
          Status::Status((Status *)local_68,INVALID_ARGUMENT,*pSVar7);
          iVar9 = 0;
        }
        if (local_68._0_4_ == OK) {
          sVar8 = iVar4 * local_b0;
          if ((sVar8 - 0x4979cb9e01 < 0xffffff6d0c68c3ff) ||
             (iVar9 = iVar9 * iVar4, iVar9 + 0xc4653600U < 0x88ca6c01)) {
            StringPiece::StringPiece(&local_110,"Duration value exceeds limits");
            Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,local_110);
          }
          else {
            StringPiece::StringPiece(&local_100,"seconds");
            local_e0._8_4_ = 2;
            local_e0._0_8_ = &PTR__DataPiece_003e3c20;
            local_c0 = false;
            local_e0._16_8_ = sVar8;
            ProtoWriter::RenderDataPiece
                      (&local_70->super_ProtoWriter,local_100,(DataPiece *)local_e0);
            StringPiece::StringPiece(&local_f0,"nanos");
            local_e0._8_4_ = 1;
            local_e0._0_8_ = &PTR__DataPiece_003e3c20;
            local_e0._16_4_ = iVar9;
            local_c0 = false;
            ProtoWriter::RenderDataPiece
                      (&local_70->super_ProtoWriter,local_f0,(DataPiece *)local_e0);
            Status::Status(__return_storage_ptr__);
          }
        }
        else {
          Status::Status(__return_storage_ptr__,(Status *)local_68);
        }
        this = &nanos_status;
        goto LAB_00339f0e;
      }
      pcVar5 = "Invalid duration format, failed to parse seconds";
      pSVar7 = &local_150;
    }
    else {
      pcVar5 = "Illegal duration format; duration must end with \'s\'";
      pSVar7 = &local_170;
    }
    StringPiece::StringPiece(pSVar7,pcVar5);
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,*pSVar7);
  }
  else {
    if (data->type_ == TYPE_NULL) {
      Status::Status(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    nanos_status._0_8_ = 0x29;
    local_68 = (undefined1  [8])"Invalid data type for duration, value is ";
    StringPiece::StringPiece(&local_180,"");
    default_string.length_ = local_180.length_;
    default_string.ptr_ = local_180.ptr_;
    DataPiece::ValueAsStringOrDefault_abi_cxx11_((string *)local_130,data,default_string);
    local_e0._8_8_ = local_130._8_8_;
    local_e0._0_8_ = local_130._0_8_;
    StrCat_abi_cxx11_(&local_a0,(protobuf *)local_68,(AlphaNum *)local_e0,
                      (AlphaNum *)local_180.length_);
    sVar2 = StringPiece::CheckedSsizeTFromSizeT(local_a0._M_string_length);
    error_message.length_ = sVar2;
    error_message.ptr_ = local_a0._M_dataplus._M_p;
    Status::Status(__return_storage_ptr__,INVALID_ARGUMENT,error_message);
    std::__cxx11::string::~string((string *)&local_a0);
    this = (Status *)local_130;
LAB_00339f0e:
    std::__cxx11::string::~string((string *)this);
  }
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectWriter::RenderDuration(ProtoStreamObjectWriter* ow,
                                               const DataPiece& data) {
  if (data.type() == DataPiece::TYPE_NULL) return Status();
  if (data.type() != DataPiece::TYPE_STRING) {
    return Status(util::error::INVALID_ARGUMENT,
                  StrCat("Invalid data type for duration, value is ",
                               data.ValueAsStringOrDefault("")));
  }

  StringPiece value(data.str());

  if (!HasSuffixString(value, "s")) {
    return Status(util::error::INVALID_ARGUMENT,
                  "Illegal duration format; duration must end with 's'");
  }
  value = value.substr(0, value.size() - 1);
  int sign = 1;
  if (HasPrefixString(value, "-")) {
    sign = -1;
    value = value.substr(1);
  }

  StringPiece s_secs, s_nanos;
  SplitSecondsAndNanos(value, &s_secs, &s_nanos);
  uint64 unsigned_seconds;
  if (!safe_strtou64(s_secs, &unsigned_seconds)) {
    return Status(util::error::INVALID_ARGUMENT,
                  "Invalid duration format, failed to parse seconds");
  }

  int32 nanos = 0;
  Status nanos_status = GetNanosFromStringPiece(
      s_nanos, "Invalid duration format, failed to parse nano seconds",
      "Duration value exceeds limits", &nanos);
  if (!nanos_status.ok()) {
    return nanos_status;
  }
  nanos = sign * nanos;

  int64 seconds = sign * unsigned_seconds;
  if (seconds > kDurationMaxSeconds || seconds < kDurationMinSeconds ||
      nanos <= -kNanosPerSecond || nanos >= kNanosPerSecond) {
    return Status(util::error::INVALID_ARGUMENT,
                  "Duration value exceeds limits");
  }

  ow->ProtoWriter::RenderDataPiece("seconds", DataPiece(seconds));
  ow->ProtoWriter::RenderDataPiece("nanos", DataPiece(nanos));
  return Status();
}